

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DifferentialTest.h
# Opt level: O0

void DiffTestRecurse<Blob<256>,Blob<160>>
               (pfHash hash,Blob<256> *k1,Blob<256> *k2,Blob<160> *h1,Blob<160> *h2,int start,
               int bitsleft,vector<Blob<256>,_std::allocator<Blob<256>_>_> *diffs)

{
  bool bVar1;
  int iVar2;
  Blob<256> *in_RCX;
  Blob<256> *in_RDX;
  pfHash in_RSI;
  code *in_RDI;
  Blob<160> *in_R8;
  uint32_t in_R9D;
  int unaff_retaddr;
  int in_stack_00000008;
  undefined4 in_stack_0000000c;
  Blob<256> *in_stack_00000010;
  int i;
  int bits;
  int in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  Blob<256> *in_stack_ffffffffffffff90;
  Blob<256> *in_stack_ffffffffffffffa8;
  undefined4 uVar3;
  uint32_t uVar4;
  
  uVar3 = 0x100;
  uVar4 = in_R9D;
  for (; (int)in_R9D < 0x100; in_R9D = in_R9D + 1) {
    flipbit(in_RDX,0x20,in_R9D);
    iVar2 = in_stack_00000008 + -1;
    (*in_RDI)(in_RDX,0x20,0,in_R8);
    bVar1 = Blob<160>::operator==((Blob<160> *)in_RCX,in_R8);
    if (bVar1) {
      Blob<256>::operator^(in_stack_ffffffffffffffa8,in_stack_00000010);
      std::vector<Blob<256>,_std::allocator<Blob<256>_>_>::push_back
                ((vector<Blob<256>,_std::allocator<Blob<256>_>_> *)in_stack_ffffffffffffff90,
                 (value_type *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    }
    if (iVar2 != 0) {
      in_stack_ffffffffffffff90 = in_stack_00000010;
      DiffTestRecurse<Blob<256>,Blob<160>>
                (in_RSI,in_RDX,in_RCX,in_R8,(Blob<160> *)CONCAT44(uVar4,uVar3),in_R9D,unaff_retaddr,
                 (vector<Blob<256>,_std::allocator<Blob<256>_>_> *)CONCAT44(in_stack_0000000c,iVar2)
                );
      in_stack_ffffffffffffff88 = iVar2;
    }
    flipbit(in_RDX,0x20,in_R9D);
  }
  return;
}

Assistant:

void DiffTestRecurse ( pfHash hash, keytype & k1, keytype & k2, hashtype & h1, hashtype & h2, int start, int bitsleft, std::vector<keytype> & diffs )
{
  const int bits = sizeof(keytype)*8;

  for(int i = start; i < bits; i++)
  {
    flipbit(&k2,sizeof(k2),i);
    bitsleft--;

    hash(&k2,sizeof(k2),0,&h2);

    if(h1 == h2)
    {
      diffs.push_back(k1 ^ k2);
    }

    if(bitsleft)
    {
      DiffTestRecurse(hash,k1,k2,h1,h2,i+1,bitsleft,diffs);
    }

    flipbit(&k2,sizeof(k2),i);
    bitsleft++;
  }
}